

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTableEntry::UpdateConstraintsOnColumnDrop
          (DuckTableEntry *this,LogicalIndex *removed_index,
          vector<duckdb::LogicalIndex,_true> *adjusted_indices,RemoveColumnInfo *info,
          CreateTableInfo *create_info,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints,bool is_generated)

{
  ForeignKeyType FVar1;
  size_t __n;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  reference this_00;
  const_reference this_01;
  pointer pCVar5;
  BoundNotNullConstraint *pBVar6;
  NotNullConstraint *this_02;
  UniqueConstraint *this_03;
  LogicalIndex LVar7;
  const_reference pvVar8;
  ForeignKeyConstraint *pFVar9;
  reference pvVar10;
  pointer pBVar11;
  BoundCheckConstraint *pBVar12;
  __node_base_ptr p_Var13;
  CatalogException *pCVar14;
  InternalException *this_04;
  size_type sVar15;
  _Head_base<0UL,_duckdb::Constraint_*,_false> _Var16;
  size_type __n_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  columns;
  string local_108;
  vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
  *local_e8;
  LogicalIndex *local_e0;
  _Head_base<0UL,_duckdb::Constraint_*,_false> local_d8;
  vector<duckdb::LogicalIndex,_true> *local_d0;
  ColumnList *local_c8;
  DuckTableEntry *local_c0;
  NotNullConstraint *local_b8;
  NotNullConstraint *local_b0;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *local_a0;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_TableCatalogEntry).constraints.
      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_TableCatalogEntry).constraints.
      super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_a0 = &(this->super_TableCatalogEntry).constraints;
    local_e8 = (vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&create_info->constraints;
    local_c8 = &(this->super_TableCatalogEntry).columns;
    __n_00 = 0;
    local_e0 = removed_index;
    local_d0 = adjusted_indices;
    local_c0 = this;
    local_98 = bound_constraints;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[](local_a0,__n_00);
      this_01 = vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                ::operator[](local_98,__n_00);
      pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_00);
      switch(pCVar5->type) {
      case NOT_NULL:
        pBVar11 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                  ::operator->(this_01);
        pBVar6 = BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(pBVar11);
        LVar7 = ColumnList::PhysicalToLogical(local_c8,(pBVar6->index).index);
        if (LVar7.index != local_e0->index) {
          pvVar8 = vector<duckdb::LogicalIndex,_true>::operator[](local_d0,LVar7.index);
          LVar7.index = pvVar8->index;
          this_02 = (NotNullConstraint *)operator_new(0x18);
          NotNullConstraint::NotNullConstraint(this_02,LVar7);
          local_108._M_dataplus._M_p = (pointer)this_02;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                    (local_e8,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                               *)&local_108);
          _Var16._M_head_impl = (Constraint *)local_108._M_dataplus._M_p;
          break;
        }
        goto LAB_015674a9;
      case CHECK:
        pBVar11 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                  ::operator->(this_01);
        pBVar12 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar11);
        if (is_generated) {
          pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_00);
          (*pCVar5->_vptr_Constraint[3])(&local_108,pCVar5);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                    (local_e8,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                               *)&local_108);
          _Var16._M_head_impl = (Constraint *)local_108._M_dataplus._M_p;
        }
        else {
          local_b8 = (NotNullConstraint *)
                     ColumnList::LogicalToPhysical(local_c8,(LogicalIndex)local_e0->index);
          p_Var13 = ::std::
                    _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::_M_find_before_node
                              (&(pBVar12->bound_columns)._M_h,
                               (ulong)local_b8 % (pBVar12->bound_columns)._M_h._M_bucket_count,
                               (key_type *)&local_b8,(__hash_code)local_b8);
          if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
            if (1 < (pBVar12->bound_columns)._M_h._M_element_count) {
              pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,
                         "Cannot drop column \"%s\" because there is a CHECK constraint that depends on it"
                         ,"");
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              pcVar2 = (info->removed_column)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar2,pcVar2 + (info->removed_column)._M_string_length
                        );
              CatalogException::CatalogException<std::__cxx11::string>(pCVar14,&local_108,&local_50)
              ;
              __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
            }
            goto LAB_015674a9;
          }
          pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_00);
          (*pCVar5->_vptr_Constraint[3])(&local_108,pCVar5);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                    (local_e8,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                               *)&local_108);
          _Var16._M_head_impl = (Constraint *)local_108._M_dataplus._M_p;
        }
        break;
      case UNIQUE:
        pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_00);
        (*pCVar5->_vptr_Constraint[3])
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_b8,pCVar5);
        pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)&local_b8);
        this_03 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar5);
        bVar3 = UniqueConstraint::HasIndex(this_03);
        if (bVar3) {
          LVar7 = UniqueConstraint::GetIndex(this_03);
          if (LVar7.index == local_e0->index) {
            pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,
                       "Cannot drop column \"%s\" because there is a UNIQUE constraint that depends on it"
                       ,"");
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar2 = (info->removed_column)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar2,pcVar2 + (info->removed_column)._M_string_length);
            CatalogException::CatalogException<std::__cxx11::string>(pCVar14,&local_108,&local_70);
            __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
          }
          LVar7 = UniqueConstraint::GetIndex(this_03);
          pvVar8 = vector<duckdb::LogicalIndex,_true>::operator[](local_d0,LVar7.index);
          UniqueConstraint::SetIndex(this_03,(LogicalIndex)pvVar8->index);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  (local_e8,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)&local_b8);
        _Var16._M_head_impl = &local_b8->super_Constraint;
        break;
      case FOREIGN_KEY:
        pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_00);
        (*pCVar5->_vptr_Constraint[3])(&local_d8,pCVar5);
        pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)&local_d8);
        pFVar9 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar5);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_b8,
                 &(pFVar9->pk_columns).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        FVar1 = (pFVar9->info).type;
        if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b8,
                      &(pFVar9->fk_columns).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
        }
        else if ((FVar1 == FK_TYPE_SELF_REFERENCE_TABLE) &&
                ((pFVar9->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 (pFVar9->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
          sVar15 = 0;
          do {
            pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&pFVar9->fk_columns,sVar15);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_b8,pvVar10);
            sVar15 = sVar15 + 1;
          } while (sVar15 < (ulong)((long)(pFVar9->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pFVar9->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if (local_b0 != local_b8) {
          sVar15 = 0;
          do {
            pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)&local_b8,sVar15);
            __n = pvVar10->_M_string_length;
            if ((__n == (info->removed_column)._M_string_length) &&
               ((__n == 0 ||
                (iVar4 = bcmp((pvVar10->_M_dataplus)._M_p,(info->removed_column)._M_dataplus._M_p,
                              __n), iVar4 == 0)))) {
              pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,
                         "Cannot drop column \"%s\" because there is a FOREIGN KEY constraint that depends on it"
                         ,"");
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              pcVar2 = (info->removed_column)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,pcVar2,pcVar2 + (info->removed_column)._M_string_length
                        );
              CatalogException::CatalogException<std::__cxx11::string>(pCVar14,&local_108,&local_90)
              ;
              __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
            }
            sVar15 = sVar15 + 1;
          } while (sVar15 < (ulong)((long)local_b0 - (long)local_b8 >> 5));
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  (local_e8,(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)&local_d8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8);
        _Var16._M_head_impl = local_d8._M_head_impl;
        break;
      default:
        this_04 = (InternalException *)__cxa_allocate_exception(0x10);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Unsupported constraint for entry!","");
        InternalException::InternalException(this_04,&local_108);
        __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((NotNullConstraint *)_Var16._M_head_impl != (NotNullConstraint *)0x0) {
        (*((Constraint *)&(_Var16._M_head_impl)->_vptr_Constraint)->_vptr_Constraint[1])();
      }
LAB_015674a9:
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(local_c0->super_TableCatalogEntry).constraints.
                                    super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_c0->super_TableCatalogEntry).constraints.
                                    super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void DuckTableEntry::UpdateConstraintsOnColumnDrop(const LogicalIndex &removed_index,
                                                   const vector<LogicalIndex> &adjusted_indices,
                                                   const RemoveColumnInfo &info, CreateTableInfo &create_info,
                                                   const vector<unique_ptr<BoundConstraint>> &bound_constraints,
                                                   bool is_generated) {
	// handle constraints for the new table
	D_ASSERT(constraints.size() == bound_constraints.size());
	for (idx_t constr_idx = 0; constr_idx < constraints.size(); constr_idx++) {
		auto &constraint = constraints[constr_idx];
		auto &bound_constraint = bound_constraints[constr_idx];
		switch (constraint->type) {
		case ConstraintType::NOT_NULL: {
			auto &not_null_constraint = bound_constraint->Cast<BoundNotNullConstraint>();
			auto not_null_index = columns.PhysicalToLogical(not_null_constraint.index);
			if (not_null_index != removed_index) {
				// the constraint is not about this column: we need to copy it
				// we might need to shift the index back by one though, to account for the removed column
				auto new_index = adjusted_indices[not_null_index.index];
				create_info.constraints.push_back(make_uniq<NotNullConstraint>(new_index));
			}
			break;
		}
		case ConstraintType::CHECK: {
			// Generated columns can not be part of an index
			// CHECK constraint
			auto &bound_check = bound_constraint->Cast<BoundCheckConstraint>();
			// check if the removed column is part of the check constraint
			if (is_generated) {
				// generated columns can not be referenced by constraints, we can just add the constraint back
				create_info.constraints.push_back(constraint->Copy());
				break;
			}
			auto physical_index = columns.LogicalToPhysical(removed_index);
			if (bound_check.bound_columns.find(physical_index) != bound_check.bound_columns.end()) {
				if (bound_check.bound_columns.size() > 1) {
					// CHECK constraint that concerns mult
					throw CatalogException(
					    "Cannot drop column \"%s\" because there is a CHECK constraint that depends on it",
					    info.removed_column);
				} else {
					// CHECK constraint that ONLY concerns this column, strip the constraint
				}
			} else {
				// check constraint does not concern the removed column: simply re-add it
				create_info.constraints.push_back(constraint->Copy());
			}
			break;
		}
		case ConstraintType::UNIQUE: {
			auto copy = constraint->Copy();
			auto &unique = copy->Cast<UniqueConstraint>();
			if (unique.HasIndex()) {
				if (unique.GetIndex() == removed_index) {
					throw CatalogException(
					    "Cannot drop column \"%s\" because there is a UNIQUE constraint that depends on it",
					    info.removed_column);
				}
				unique.SetIndex(adjusted_indices[unique.GetIndex().index]);
			}
			create_info.constraints.push_back(std::move(copy));
			break;
		}
		case ConstraintType::FOREIGN_KEY: {
			auto copy = constraint->Copy();
			auto &fk = copy->Cast<ForeignKeyConstraint>();
			vector<string> columns = fk.pk_columns;
			if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
				columns = fk.fk_columns;
			} else if (fk.info.type == ForeignKeyType::FK_TYPE_SELF_REFERENCE_TABLE) {
				for (idx_t i = 0; i < fk.fk_columns.size(); i++) {
					columns.push_back(fk.fk_columns[i]);
				}
			}
			for (idx_t i = 0; i < columns.size(); i++) {
				if (columns[i] == info.removed_column) {
					throw CatalogException(
					    "Cannot drop column \"%s\" because there is a FOREIGN KEY constraint that depends on it",
					    info.removed_column);
				}
			}
			create_info.constraints.push_back(std::move(copy));
			break;
		}
		default:
			throw InternalException("Unsupported constraint for entry!");
		}
	}
}